

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sig.c
# Opt level: O0

int sigMain(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  err_t code_00;
  char *pcVar3;
  long in_RSI;
  int in_EDI;
  int unaff_retaddr;
  err_t code;
  char **in_stack_00000028;
  int in_stack_00000030;
  uint in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_EDI < 2) {
    iVar1 = sigUsage();
  }
  else {
    iVar1 = in_EDI + -1;
    pcVar3 = (char *)(in_RSI + 8);
    iVar2 = strCmp(pcVar3,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (iVar2 == 0) {
      code_00 = sigSign(in_stack_00000030,in_stack_00000028);
    }
    else {
      iVar2 = strCmp(pcVar3,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      if (iVar2 == 0) {
        code_00 = sigVal(in_stack_00000030,in_stack_00000028);
      }
      else {
        iVar2 = strCmp(pcVar3,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8))
        ;
        if (iVar2 == 0) {
          code_00 = sigExtr(unaff_retaddr,(char **)CONCAT44(in_stack_fffffffffffffffc,iVar1));
        }
        else {
          iVar2 = strCmp(pcVar3,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8
                                                ));
          if (iVar2 == 0) {
            code_00 = sigPrint(unaff_retaddr,(char **)CONCAT44(in_stack_fffffffffffffffc,iVar1));
          }
          else {
            code_00 = 0x259;
          }
        }
      }
    }
    if ((code_00 != 0) ||
       (iVar1 = strCmp(pcVar3,(char *)(ulong)in_stack_ffffffffffffffe8), iVar1 == 0)) {
      pcVar3 = errMsg(code_00);
      printf("bee2cmd/%s: %s\n","sig",pcVar3);
    }
    iVar1 = 0;
    if (code_00 != 0) {
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

static int sigMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return sigUsage();
	// разбор команды
	--argc, ++argv;
	if (strEq(argv[0], "sign"))
		code = sigSign(argc - 1, argv + 1);
	else if (strEq(argv[0], "val"))	
		code = sigVal(argc - 1, argv + 1);
	else if (strEq(argv[0], "extr"))
		code = sigExtr(argc - 1, argv + 1);
	else if (strEq(argv[0], "print"))
		code = sigPrint(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK || strEq(argv[0], "val"))
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return code != ERR_OK ? -1 : 0;
}